

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PreLowerPeeps.cpp
# Opt level: O3

Instr * Lowerer::TryShiftAdd(Instr *instrAdd,Opnd *opndFold,Opnd *opndAdd)

{
  StackSym *sym;
  StackSym *sym_00;
  code *pcVar1;
  bool bVar2;
  OpndKind OVar3;
  uint uVar4;
  uint uVar5;
  int32 offset;
  undefined4 *puVar6;
  IntConstOpnd *pIVar7;
  ulong uVar8;
  RegOpnd *pRVar9;
  JITTimeFunctionBody *pJVar10;
  FunctionJITTimeInfo *pFVar11;
  char16 *pcVar12;
  Opnd *pOVar13;
  RegOpnd *indexOpnd;
  IndirOpnd *src;
  Instr *pIVar14;
  uint uVar15;
  Instr *pIVar16;
  Instr *this;
  Instr *local_40;
  byte local_38;
  
  if (instrAdd->m_opcode != Add_I4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/PreLowerPeeps.cpp"
                       ,0x29,"(instrAdd->m_opcode == Js::OpCode::Add_I4)",
                       "instrAdd->m_opcode == Js::OpCode::Add_I4");
    if (!bVar2) goto LAB_0061f3d0;
    *puVar6 = 0;
  }
  if ((opndFold->field_0xb & 4) == 0) {
    return instrAdd;
  }
  OVar3 = IR::Opnd::GetKind(opndAdd);
  if (OVar3 != OpndKindReg) {
    if (opndAdd->m_type != TyInt32) {
      return instrAdd;
    }
    OVar3 = IR::Opnd::GetKind(opndAdd);
    if (OVar3 != OpndKindIntConst) {
      return instrAdd;
    }
  }
  OVar3 = IR::Opnd::GetKind(opndFold);
  if (OVar3 != OpndKindReg) {
    return instrAdd;
  }
  OVar3 = IR::Opnd::GetKind(opndFold);
  if (OVar3 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar2) goto LAB_0061f3d0;
    *puVar6 = 0;
  }
  if (((ulong)opndFold[1]._vptr_Opnd[3] & 1) == 0) {
    return instrAdd;
  }
  if (opndFold[1]._vptr_Opnd[5] == (_func_int *)0x0) {
    return instrAdd;
  }
  OVar3 = IR::Opnd::GetKind(opndFold);
  if (OVar3 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar2) goto LAB_0061f3d0;
    *puVar6 = 0;
  }
  pIVar14 = (Instr *)opndFold[1]._vptr_Opnd[5];
  this = (Instr *)0x0;
  if (((ulong)opndFold[1]._vptr_Opnd[3] & 1) != 0) {
    this = pIVar14;
  }
  if ((this->m_opcode | Break) != Shl_I4) {
    return instrAdd;
  }
  OVar3 = IR::Opnd::GetKind(this->m_src1);
  if (OVar3 != OpndKindReg) {
    return instrAdd;
  }
  OVar3 = IR::Opnd::GetKind(this->m_src2);
  if (OVar3 != OpndKindIntConst) {
    return instrAdd;
  }
  if ((this->field_0x38 & 0x10) != 0) {
    return instrAdd;
  }
  pIVar7 = IR::Opnd::AsIntConstOpnd(this->m_src2);
  uVar8 = (pIVar7->super_EncodableOpnd<long>).m_value;
  if (this->m_opcode == Mul_I4) {
LAB_0061f063:
    if (7 < uVar8 - 1) {
      return instrAdd;
    }
    uVar15 = (uint)(uVar8 - 1);
    if ((0x8bU >> (uVar15 & 0x1f) & 1) == 0) {
      return instrAdd;
    }
    uVar8 = 0x300000002000100 >> ((byte)(uVar15 << 3) & 0x3f);
  }
  else {
    if (this->m_opcode != Shl_I4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/PreLowerPeeps.cpp"
                         ,0x51,"(instrDef->m_opcode == Js::OpCode::Mul_I4)",
                         "instrDef->m_opcode == Js::OpCode::Mul_I4");
      if (!bVar2) goto LAB_0061f3d0;
      *puVar6 = 0;
      goto LAB_0061f063;
    }
    if (3 < uVar8) {
      return instrAdd;
    }
  }
  pRVar9 = IR::Opnd::AsRegOpnd(this->m_src1);
  sym = pRVar9->m_sym;
  pRVar9 = IR::Opnd::AsRegOpnd(opndFold);
  if (instrAdd->m_prev == (Instr *)0x0) {
    local_40 = (Instr *)0x0;
  }
  else {
    local_40 = instrAdd->m_prev->m_next;
  }
  sym_00 = pRVar9->m_sym;
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  pIVar16 = (Instr *)0x0;
  while (pIVar14 = pIVar14->m_next, pIVar14 != local_40) {
    if ((pIVar16 != (Instr *)0x0) && (pIVar16->m_next != pIVar14)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/PreLowerPeeps.cpp"
                         ,0x67,
                         "(__prevInstrCheck == nullptr || __prevInstrCheck->m_next == instrIter)",
                         "Modifying instr list but not using EDITING iterator!");
      if (!bVar2) goto LAB_0061f3d0;
      *puVar6 = 0;
    }
    if (pIVar14->m_kind == InstrKindBranch) {
      return instrAdd;
    }
    if ((pIVar14->field_0x38 & 0x10) != 0) {
      return instrAdd;
    }
    pRVar9 = IR::Instr::FindRegDef(pIVar14,sym);
    if (pRVar9 != (RegOpnd *)0x0) {
      return instrAdd;
    }
    bVar2 = IR::Instr::HasSymUse(pIVar14,sym_00);
    pIVar16 = pIVar14;
    if (bVar2) {
      return instrAdd;
    }
  }
  pJVar10 = JITTimeWorkItem::GetJITFunctionBody(instrAdd->m_func->m_workItem);
  uVar4 = JITTimeFunctionBody::GetSourceContextId(pJVar10);
  pFVar11 = JITTimeWorkItem::GetJITTimeInfo(instrAdd->m_func->m_workItem);
  uVar5 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar11);
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,PreLowererPeepsPhase,uVar4,uVar5);
  if (bVar2) {
    pJVar10 = JITTimeWorkItem::GetJITFunctionBody(instrAdd->m_func->m_workItem);
    pcVar12 = JITTimeFunctionBody::GetDisplayName(pJVar10);
    pJVar10 = JITTimeWorkItem::GetJITFunctionBody(instrAdd->m_func->m_workItem);
    uVar4 = JITTimeFunctionBody::GetFunctionNumber(pJVar10);
    Output::Print(L"PeepShiftAdd : %s (%d) : folding:\n",pcVar12,(ulong)uVar4);
    IR::Instr::Dump(this);
    IR::Instr::Dump(instrAdd);
  }
  OVar3 = IR::Opnd::GetKind(opndAdd);
  local_38 = (byte)uVar8;
  if (OVar3 == OpndKindReg) {
    pRVar9 = IR::Opnd::AsRegOpnd(opndAdd);
    pOVar13 = IR::Instr::UnlinkSrc1(this);
    indexOpnd = IR::Opnd::AsRegOpnd(pOVar13);
    src = IR::IndirOpnd::New(pRVar9,indexOpnd,local_38,opndFold->m_type,instrAdd->m_func);
  }
  else {
    if ((opndAdd->m_type != TyInt32) ||
       (OVar3 = IR::Opnd::GetKind(opndAdd), OVar3 != OpndKindIntConst)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/PreLowerPeeps.cpp"
                         ,0x8c,"(opndAdd->IsInt32() && opndAdd->IsIntConstOpnd())",
                         "opndAdd->IsInt32() && opndAdd->IsIntConstOpnd()");
      if (!bVar2) {
LAB_0061f3d0:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar6 = 0;
    }
    pOVar13 = IR::Instr::UnlinkSrc1(this);
    pRVar9 = IR::Opnd::AsRegOpnd(pOVar13);
    pIVar7 = IR::Opnd::AsIntConstOpnd(opndAdd);
    offset = IR::IntConstOpnd::AsInt32(pIVar7);
    src = IR::IndirOpnd::New(pRVar9,offset,local_38,opndFold->m_type,instrAdd->m_func);
  }
  pOVar13 = IR::Instr::UnlinkDst(instrAdd);
  pRVar9 = IR::Opnd::AsRegOpnd(pOVar13);
  pIVar14 = InsertLea(pRVar9,&src->super_Opnd,instrAdd);
  pJVar10 = JITTimeWorkItem::GetJITFunctionBody(instrAdd->m_func->m_workItem);
  uVar4 = JITTimeFunctionBody::GetSourceContextId(pJVar10);
  pFVar11 = JITTimeWorkItem::GetJITTimeInfo(instrAdd->m_func->m_workItem);
  uVar5 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar11);
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,PreLowererPeepsPhase,uVar4,uVar5);
  if (bVar2) {
    pJVar10 = JITTimeWorkItem::GetJITFunctionBody(instrAdd->m_func->m_workItem);
    pcVar12 = JITTimeFunctionBody::GetDisplayName(pJVar10);
    pJVar10 = JITTimeWorkItem::GetJITFunctionBody(instrAdd->m_func->m_workItem);
    uVar4 = JITTimeFunctionBody::GetFunctionNumber(pJVar10);
    Output::Print(L"into:\n",pcVar12,(ulong)uVar4);
    IR::Instr::Dump(pIVar14);
  }
  IR::Instr::Remove(instrAdd);
  IR::Instr::Remove(this);
  return pIVar14;
}

Assistant:

IR::Instr *
Lowerer::TryShiftAdd(IR::Instr *instrAdd, IR::Opnd * opndFold, IR::Opnd * opndAdd)
{
    Assert(instrAdd->m_opcode == Js::OpCode::Add_I4);
    if (!opndFold->GetIsDead())
    {
        return instrAdd;
    }

    if (!(opndAdd->IsRegOpnd() || (opndAdd->IsInt32() && opndAdd->IsIntConstOpnd())))
    {
        return instrAdd;
    }

    if (!opndFold->IsRegOpnd() || !opndFold->AsRegOpnd()->m_sym->IsSingleDef())
    {
        return instrAdd;
    }

    IR::Instr * instrDef = opndFold->AsRegOpnd()->m_sym->GetInstrDef();

    if ((instrDef->m_opcode != Js::OpCode::Shl_I4 && instrDef->m_opcode != Js::OpCode::Mul_I4) || !instrDef->GetSrc1()->IsRegOpnd()  || !instrDef->GetSrc2()->IsIntConstOpnd())
    {
        return instrAdd;
    }

    if (instrDef->HasBailOutInfo())
    {
        return instrAdd;
    }

    byte scale = 0;
    IntConstType constVal = instrDef->GetSrc2()->AsIntConstOpnd()->GetValue();
    if (instrDef->m_opcode == Js::OpCode::Shl_I4)
    {
        if (constVal < 0 || constVal > 3)
        {
            return instrAdd;
        }
        scale = (byte)constVal;
    }
    else
    {
        Assert(instrDef->m_opcode == Js::OpCode::Mul_I4);
        switch (constVal)
        {
        case 1:
            scale = 0;
            break;
        case 2:
            scale = 1;
            break;
        case 4:
            scale = 2;
            break;
        case 8:
            scale = 3;
            break;
        default:
            return instrAdd;
        }
    }

    StackSym * defSrc1Sym = instrDef->GetSrc1()->AsRegOpnd()->m_sym;
    StackSym * foldSym = opndFold->AsRegOpnd()->m_sym;
    FOREACH_INSTR_IN_RANGE(instrIter, instrDef->m_next, instrAdd->m_prev)
    {
        // if any branch between def-use, don't do peeps on it because branch target might depend on the def
        if (instrIter->IsBranchInstr())
        {
            return instrAdd;
        }
        if (instrIter->HasBailOutInfo())
        {
            return instrAdd;
        }
        if (instrIter->FindRegDef(defSrc1Sym))
        {
            return instrAdd;
        }
        if (instrIter->HasSymUse(foldSym))
        {
            return instrAdd;
        }
    } NEXT_INSTR_IN_RANGE;

#if DBG_DUMP
    if (PHASE_TRACE(Js::PreLowererPeepsPhase, instrAdd->m_func))
    {
        Output::Print(_u("PeepShiftAdd : %s (%d) : folding:\n"), instrAdd->m_func->GetJITFunctionBody()->GetDisplayName(), instrAdd->m_func->GetFunctionNumber());
        instrDef->Dump();
        instrAdd->Dump();
    }
#endif

    IR::IndirOpnd * leaOpnd = nullptr;
    if (opndAdd->IsRegOpnd())
    {
        leaOpnd = IR::IndirOpnd::New(opndAdd->AsRegOpnd(), instrDef->UnlinkSrc1()->AsRegOpnd(), scale, opndFold->GetType(), instrAdd->m_func);
    }
    else
    {
        Assert(opndAdd->IsInt32() && opndAdd->IsIntConstOpnd());
        leaOpnd = IR::IndirOpnd::New(instrDef->UnlinkSrc1()->AsRegOpnd(), opndAdd->AsIntConstOpnd()->AsInt32(), scale, opndFold->GetType(), instrAdd->m_func);
    }

    IR::Instr * leaInstr = InsertLea(instrAdd->UnlinkDst()->AsRegOpnd(), leaOpnd, instrAdd);

#if DBG_DUMP
    if (PHASE_TRACE(Js::PreLowererPeepsPhase, instrAdd->m_func))
    {
        Output::Print(_u("into:\n"), instrAdd->m_func->GetJITFunctionBody()->GetDisplayName(), instrAdd->m_func->GetFunctionNumber());
        leaInstr->Dump();
    }
#endif

    instrAdd->Remove();
    instrDef->Remove();

    return leaInstr;
}